

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

string * __thiscall
t_php_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  uint uVar2;
  _func_int *p_Var3;
  __type _Var4;
  int iVar5;
  t_const_value_type tVar6;
  t_type *ptVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  _Base_ptr p_Var9;
  int64_t iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  _func_int **pp_Var11;
  char *pcVar12;
  t_type *ptVar13;
  pointer pptVar14;
  undefined1 auVar15 [12];
  string local_210;
  string *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream out;
  
  local_1f0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  ptVar7 = t_type::get_true_type(type);
  iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[5])(ptVar7);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[10])(ptVar7);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xb])(ptVar7);
      if (((char)iVar5 == '\0') &&
         (iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xc])(ptVar7), (char)iVar5 == '\0')) {
        iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0x10])(ptVar7);
        if ((char)iVar5 == '\0') {
          iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xe])(ptVar7);
          if (((char)iVar5 != '\0') ||
             (iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xf])(ptVar7), (char)iVar5 != '\0')) {
            (*(ptVar7->super_t_doc)._vptr_t_doc[0xe])(ptVar7);
            ptVar13 = *(t_type **)&ptVar7[1].super_t_doc.has_doc_;
            poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                     "array(");
            std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + 1;
            for (pptVar14 = (value->listVal_).
                            super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                pptVar14 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish; pptVar14 = pptVar14 + 1) {
              t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
              std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                              (string *)&local_210);
              std::__cxx11::string::~string((string *)&local_210);
              render_const_value_abi_cxx11_(&local_210,this,ptVar13,*pptVar14);
              std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                              (string *)&local_210);
              std::__cxx11::string::~string((string *)&local_210);
              iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xf])(ptVar7);
              if ((char)iVar5 != '\0') {
                std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>," => true");
              }
              poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,",");
              std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
            }
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + -1;
            poVar8 = t_generator::indent((t_generator *)this,
                                         &out.super_basic_ostream<char,_std::char_traits<char>_>);
            std::operator<<(poVar8,")");
          }
        }
        else {
          ptVar13 = *(t_type **)&ptVar7[1].super_t_doc.has_doc_;
          ptVar7 = *(t_type **)&ptVar7[1].annotations_._M_t._M_impl;
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"array(")
          ;
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          for (p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var9 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
            t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                            (string *)&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            render_const_value_abi_cxx11_(&local_210,this,ptVar13,*(t_const_value **)(p_Var9 + 1));
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                            (string *)&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>," => ");
            render_const_value_abi_cxx11_
                      (&local_210,this,ptVar7,(t_const_value *)p_Var9[1]._M_parent);
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                            (string *)&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,",");
            std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          }
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar8 = t_generator::indent((t_generator *)this,
                                       &out.super_basic_ostream<char,_std::char_traits<char>_>);
          std::operator<<(poVar8,")");
        }
      }
      else {
        poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"new ");
        php_namespace_abi_cxx11_(&local_210,this,ptVar7->program_);
        poVar8 = std::operator<<(poVar8,(string *)&local_210);
        iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[3])(ptVar7);
        poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var,iVar5));
        poVar8 = std::operator<<(poVar8,"(array(");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_210);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        for (p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          ptVar13 = (t_type *)0x0;
          for (pp_Var11 = ptVar7[1].super_t_doc._vptr_t_doc;
              pp_Var11 != (_func_int **)ptVar7[1].super_t_doc.doc_._M_dataplus._M_p;
              pp_Var11 = pp_Var11 + 1) {
            p_Var3 = *pp_Var11;
            std::__cxx11::string::string
                      ((string *)&local_210,(string *)(*(long *)(p_Var9 + 1) + 0x48));
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var3 + 0x68),&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            if (_Var4) {
              ptVar13 = *(t_type **)(*pp_Var11 + 0x60);
            }
          }
          if (ptVar13 == (t_type *)0x0) {
            __return_storage_ptr___00 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
            iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[3])(ptVar7);
            std::operator+(&local_1c8,"type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar5));
            std::operator+(&local_210,&local_1c8," has no field ");
            std::__cxx11::string::string
                      ((string *)&local_1e8,(string *)(*(long *)(p_Var9 + 1) + 0x48));
            std::operator+(__return_storage_ptr___00,&local_210,&local_1e8);
            __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                        std::__cxx11::string::~string);
          }
          t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
          std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          render_const_value_abi_cxx11_
                    (&local_210,this,g_type_string,*(t_const_value **)(p_Var9 + 1));
          std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>," => ");
          render_const_value_abi_cxx11_
                    (&local_210,this,ptVar13,(t_const_value *)p_Var9[1]._M_parent);
          std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,",");
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent((t_generator *)this,
                                     &out.super_basic_ostream<char,_std::char_traits<char>_>);
        std::operator<<(poVar8,"))");
      }
    }
    else {
      poVar8 = t_generator::indent((t_generator *)this,
                                   &out.super_basic_ostream<char,_std::char_traits<char>_>);
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)poVar8);
    }
  }
  else {
    uVar2 = *(uint *)&ptVar7[1].super_t_doc._vptr_t_doc;
    switch(uVar2) {
    case 1:
      poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,'\"');
      t_generator::get_escaped_string_abi_cxx11_(&local_210,(t_generator *)this,value);
      poVar8 = std::operator<<(poVar8,(string *)&local_210);
      std::operator<<(poVar8,'\"');
      std::__cxx11::string::~string((string *)&local_210);
      break;
    case 2:
      iVar10 = t_const_value::get_integer(value);
      pcVar12 = "false";
      if (0 < iVar10) {
        pcVar12 = "true";
      }
      std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
      break;
    case 7:
      tVar6 = t_const_value::get_type(value);
      if (tVar6 != CV_INTEGER) {
        std::ostream::_M_insert<double>(value->doubleVal_);
        break;
      }
    case 3:
    case 4:
    case 5:
    case 6:
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)&out);
      break;
    default:
      auVar15 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_210,(t_base_type *)(ulong)uVar2,auVar15._8_4_);
      std::operator+(auVar15._0_8_,"compiler error: no const of base type ",&local_210);
      __cxa_throw(auVar15._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return local_1f0;
}

Assistant:

string t_php_generator::render_const_value(t_type* type, t_const_value* value) {
  std::ostringstream out;
  type = get_true_type(type);
  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    indent(out) << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << "new " << php_namespace(type->get_program()) << type->get_name() << "(array(" << endl;
    indent_up();
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      out << indent();
      out << render_const_value(g_type_string, v_iter->first);
      out << " => ";
      out << render_const_value(field_type, v_iter->second);
      out << "," << endl;
    }
    indent_down();
    indent(out) << "))";
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    out << "array(" << endl;
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent();
      out << render_const_value(ktype, v_iter->first);
      out << " => ";
      out << render_const_value(vtype, v_iter->second);
      out << "," << endl;
    }
    indent_down();
    indent(out) << ")";
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    out << "array(" << endl;
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent();
      out << render_const_value(etype, *v_iter);
      if (type->is_set()) {
        out << " => true";
      }
      out << "," << endl;
    }
    indent_down();
    indent(out) << ")";
  }
  return out.str();
}